

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O1

void __thiscall
crnlib::
hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
::~hash_map(hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
            *this)

{
  raw_node *prVar1;
  
  if ((this->m_values).m_size != 0) {
    prVar1 = (this->m_values).m_p;
    if (prVar1 != (raw_node *)0x0) {
      crnlib_free(prVar1);
      (this->m_values).m_p = (raw_node *)0x0;
      (this->m_values).m_size = 0;
      (this->m_values).m_capacity = 0;
    }
    this->m_hash_shift = 0x20;
    this->m_num_valid = 0;
    this->m_grow_threshold = 0;
  }
  prVar1 = (this->m_values).m_p;
  if (prVar1 != (raw_node *)0x0) {
    crnlib_free(prVar1);
  }
  return;
}

Assistant:

inline ~hash_map() {
    clear();
  }